

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strtolower(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  byte *zString;
  ushort **ppuVar2;
  __int32_t **pp_Var3;
  byte *pbVar4;
  int c;
  int nLen;
  __int32_t local_30;
  int local_2c;
  
  if (nArg < 1) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    zString = (byte *)jx9_value_to_string(*apArg,&local_2c);
    if ((long)local_2c < 1) {
      jx9_value_string(pCtx->pRet,"",0);
    }
    else {
      pbVar4 = zString + local_2c;
      do {
        if (*zString < 0xc0) {
          bVar1 = *zString;
          local_30 = (__int32_t)(char)bVar1;
          ppuVar2 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar1 * 2 + 1) & 1) != 0) {
            pp_Var3 = __ctype_tolower_loc();
            local_30 = (*pp_Var3)[(char)*zString];
          }
          jx9_value_string(pCtx->pRet,(char *)&local_30,1);
        }
        else {
          jx9_value_string(pCtx->pRet,(char *)zString,1);
        }
        zString = zString + 1;
      } while (zString < pbVar4);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strtolower(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zCur, *zEnd;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	zEnd = &zString[nLen];
	for(;;){
		if( zString >= zEnd ){
			/* No more input, break immediately */
			break;
		}
		if( (unsigned char)zString[0] >= 0xc0 ){
			/* UTF-8 stream, output verbatim */
			zCur = zString;
			zString++;
			while( zString < zEnd && ((unsigned char)zString[0] & 0xc0) == 0x80){
				zString++;
			}
			/* Append UTF-8 stream */
			jx9_result_string(pCtx, zCur, (int)(zString-zCur));
		}else{
			int c = zString[0];
			if( SyisUpper(c) ){
				c = SyToLower(zString[0]);
			}
			/* Append character */
			jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			/* Advance the cursor */
			zString++;
		}
	}
	return JX9_OK;
}